

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O3

void __thiscall
HighsSparseMatrix::addCols(HighsSparseMatrix *this,HighsSparseMatrix *new_cols,int8_t *in_partition)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  uint uVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  MatrixFormat MVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar18;
  int iVar19;
  size_type __n;
  int iVar21;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  vector<int,_std::allocator<int>_> new_row_length;
  value_type_conflict2 local_4c;
  undefined1 local_48 [16];
  pointer local_38;
  int iVar17;
  long lVar23;
  
  uVar1 = new_cols->num_col_;
  uVar18 = (ulong)uVar1;
  uVar16 = uVar1;
  if (new_cols->format_ != kColwise) {
    uVar16 = new_cols->num_row_;
  }
  if (uVar18 != 0) {
    uVar16 = (new_cols->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[(int)uVar16];
    uVar15 = (ulong)uVar16;
    iVar2 = this->num_col_;
    lVar14 = (long)iVar2;
    iVar21 = this->num_row_;
    __n = (size_type)iVar21;
    MVar10 = this->format_;
    iVar19 = iVar21;
    if (MVar10 == kColwise) {
      iVar19 = iVar2;
    }
    iVar19 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[iVar19];
    if ((MVar10 == kRowwise) && (iVar19 < (int)uVar16)) {
      ensureColwise(this);
      MVar10 = this->format_;
    }
    this_00 = &this->start_;
    iVar11 = iVar19 + uVar16;
    if (MVar10 == kColwise) {
      std::vector<int,_std::allocator<int>_>::resize(this_00,(long)(int)(iVar2 + uVar1 + 1));
      auVar9 = _DAT_003beea0;
      if (uVar16 == 0) {
        if (0 < (int)uVar1) {
          piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar13 = uVar18 - 1;
          auVar20._8_4_ = (int)lVar13;
          auVar20._0_8_ = lVar13;
          auVar20._12_4_ = (int)((ulong)lVar13 >> 0x20);
          lVar13 = 0;
          auVar20 = auVar20 ^ _DAT_003beea0;
          auVar22 = _DAT_003bf640;
          auVar24 = _DAT_003bee90;
          do {
            auVar25 = auVar24 ^ auVar9;
            iVar21 = auVar20._4_4_;
            if ((bool)(~(auVar25._4_4_ == iVar21 && auVar20._0_4_ < auVar25._0_4_ ||
                        iVar21 < auVar25._4_4_) & 1)) {
              *(int *)((long)piVar3 + lVar13 + lVar14 * 4) = iVar19;
            }
            if ((auVar25._12_4_ != auVar20._12_4_ || auVar25._8_4_ <= auVar20._8_4_) &&
                auVar25._12_4_ <= auVar20._12_4_) {
              *(int *)((long)piVar3 + lVar13 + lVar14 * 4 + 4) = iVar19;
            }
            auVar25 = auVar22 ^ auVar9;
            iVar17 = auVar25._4_4_;
            if (iVar17 <= iVar21 && (iVar17 != iVar21 || auVar25._0_4_ <= auVar20._0_4_)) {
              *(int *)((long)piVar3 + lVar13 + lVar14 * 4 + 8) = iVar19;
              *(int *)((long)piVar3 + lVar13 + lVar14 * 4 + 0xc) = iVar19;
            }
            lVar23 = auVar24._8_8_;
            auVar24._0_8_ = auVar24._0_8_ + 4;
            auVar24._8_8_ = lVar23 + 4;
            lVar23 = auVar22._8_8_;
            auVar22._0_8_ = auVar22._0_8_ + 4;
            auVar22._8_8_ = lVar23 + 4;
            lVar13 = lVar13 + 0x10;
          } while ((ulong)(uVar1 + 3 >> 2) << 4 != lVar13);
        }
      }
      else if (0 < (int)uVar1) {
        piVar3 = (new_cols->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar12 = 0;
        do {
          piVar4[lVar14 + uVar12] = piVar3[uVar12] + iVar19;
          uVar12 = uVar12 + 1;
        } while (uVar18 != uVar12);
      }
      (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(int)(iVar2 + uVar1)] = iVar11;
      this->num_col_ = this->num_col_ + uVar1;
      if (0 < (int)uVar16) {
        std::vector<int,_std::allocator<int>_>::resize(&this->index_,(long)iVar11);
        std::vector<double,_std::allocator<double>_>::resize(&this->value_,(long)iVar11);
        piVar3 = (new_cols->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (new_cols->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar18 = 0;
        do {
          piVar4[(long)iVar19 + uVar18] = piVar3[uVar18];
          pdVar7[(long)iVar19 + uVar18] = pdVar6[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar15 != uVar18);
      }
    }
    else {
      if (uVar16 != 0) {
        this_01 = &this->index_;
        std::vector<int,_std::allocator<int>_>::resize(this_01,(long)iVar11);
        this_02 = &this->value_;
        std::vector<double,_std::allocator<double>_>::resize(this_02,(long)iVar11);
        local_48 = (undefined1  [16])0x0;
        local_38 = (pointer)0x0;
        local_4c = 0;
        std::vector<int,_std::allocator<int>_>::_M_fill_assign
                  ((vector<int,_std::allocator<int>_> *)local_48,__n,&local_4c);
        if (0 < (int)uVar16) {
          piVar3 = (new_cols->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar12 = 0;
          do {
            *(int *)(local_48._0_8_ + (long)piVar3[uVar12] * 4) =
                 *(int *)(local_48._0_8_ + (long)piVar3[uVar12] * 4) + 1;
            uVar12 = uVar12 + 1;
          } while (uVar15 != uVar12);
        }
        piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar19 = piVar3[__n];
        piVar3[__n] = iVar11;
        if (0 < iVar21) {
          piVar4 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar6 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            iVar21 = *(int *)(local_48._0_8_ + (__n - 1) * 4);
            iVar17 = (int)uVar15;
            uVar16 = iVar17 - iVar21;
            uVar15 = (ulong)uVar16;
            iVar11 = piVar3[__n - 1];
            *(uint *)(local_48._0_8_ + (__n - 1) * 4) = uVar16 + iVar19;
            if (iVar11 < iVar19) {
              lVar14 = (long)iVar19;
              do {
                piVar4[((long)iVar17 + lVar14 + -1) - (long)iVar21] = piVar4[lVar14 + -1];
                pdVar6[((long)iVar17 + lVar14 + -1) - (long)iVar21] = pdVar6[lVar14 + -1];
                lVar14 = lVar14 + -1;
              } while (iVar11 < lVar14);
            }
            piVar3[__n - 1] = uVar16 + iVar11;
            bVar8 = 1 < (long)__n;
            __n = __n - 1;
            iVar19 = iVar11;
          } while (bVar8);
        }
        if (0 < (int)uVar1) {
          piVar3 = (new_cols->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar4 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar6 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          iVar21 = *piVar3;
          uVar15 = 0;
          do {
            uVar12 = uVar15 + 1;
            iVar19 = piVar3[uVar15 + 1];
            if (iVar21 < piVar3[uVar15 + 1]) {
              piVar5 = (new_cols->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar7 = (new_cols->value_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              lVar14 = (long)iVar21;
              do {
                iVar21 = piVar5[lVar14];
                piVar4[*(int *)(local_48._0_8_ + (long)iVar21 * 4)] = (int)uVar15 + iVar2;
                iVar19 = *(int *)(local_48._0_8_ + (long)iVar21 * 4);
                pdVar6[iVar19] = pdVar7[lVar14];
                *(int *)(local_48._0_8_ + (long)iVar21 * 4) = iVar19 + 1;
                lVar14 = lVar14 + 1;
                iVar19 = piVar3[uVar12];
              } while (lVar14 < piVar3[uVar12]);
            }
            iVar21 = iVar19;
            uVar15 = uVar12;
          } while (uVar12 != uVar18);
        }
        if ((pointer)local_48._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_48._0_8_);
        }
      }
      this->num_col_ = this->num_col_ + uVar1;
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::addCols(const HighsSparseMatrix new_cols,
                                const int8_t* in_partition) {
  assert(new_cols.isColwise());
  const HighsInt num_new_col = new_cols.num_col_;
  const HighsInt num_new_nz = new_cols.numNz();
  const vector<HighsInt>& new_matrix_start = new_cols.start_;
  const vector<HighsInt>& new_matrix_index = new_cols.index_;
  const vector<double>& new_matrix_value = new_cols.value_;

  assert(this->formatOk());
  // Adding columns to a row-wise partitioned matrix needs the
  // partition information
  const bool partitioned = this->format_ == MatrixFormat::kRowwisePartitioned;
  // Cannot handle the row-wise partitioned case
  assert(!partitioned);
  if (partitioned) {
    //    if (in_partition == NULL) { printf("in_partition == NULL\n"); }
    assert(in_partition != NULL);
  }
  assert(num_new_col >= 0);
  assert(num_new_nz >= 0);
  if (num_new_col == 0) {
    // No columns are being added, so check that no nonzeros are being
    // added
    assert(num_new_nz == 0);
    return;
  }
  // Adding a positive number of columns to a matrix
  if (num_new_nz) {
    // Nonzeros are being added, so ensure that non-null data are
    // being passed
    assert(!new_matrix_start.empty());
    assert(!new_matrix_index.empty());
    assert(!new_matrix_value.empty());
  }
  HighsInt num_col = this->num_col_;
  HighsInt num_row = this->num_row_;
  HighsInt num_nz = this->numNz();
  // Check that nonzeros aren't being appended to a matrix with no rows
  assert(num_new_nz <= 0 || num_row > 0);

  // If matrix is currently a standard row-wise matrix and there are
  // more new nonzeros than current nonzeros so flip column-wise
  if (this->format_ == MatrixFormat::kRowwise && num_new_nz > num_nz)
    this->ensureColwise();

  // Determine the new number of columns and nonzeros in the matrix
  HighsInt new_num_col = num_col + num_new_col;
  HighsInt new_num_nz = num_nz + num_new_nz;

  if (this->isColwise()) {
    // Matrix is column-wise
    this->start_.resize(new_num_col + 1);
    // Append the starts of the new columns
    if (num_new_nz) {
      // Nontrivial number of nonzeros being added, so use new_matrix_start
      for (HighsInt iNewCol = 0; iNewCol < num_new_col; iNewCol++)
        this->start_[num_col + iNewCol] = num_nz + new_matrix_start[iNewCol];
    } else {
      // No nonzeros being added, so new_matrix_start may be null, but entries
      // of zero are implied.
      for (HighsInt iNewCol = 0; iNewCol < num_new_col; iNewCol++)
        this->start_[num_col + iNewCol] = num_nz;
    }
    this->start_[num_col + num_new_col] = new_num_nz;
    // Update the number of columns
    this->num_col_ += num_new_col;
    // If no nonzeros are being added then there's nothing else to do
    if (num_new_nz <= 0) return;
    // Adding a non-trivial matrix: resize the column-wise matrix arrays
    // accordingly
    this->index_.resize(new_num_nz);
    this->value_.resize(new_num_nz);
    // Copy in the new indices and values
    for (HighsInt iEl = 0; iEl < num_new_nz; iEl++) {
      this->index_[num_nz + iEl] = new_matrix_index[iEl];
      this->value_[num_nz + iEl] = new_matrix_value[iEl];
    }
  } else {
    // Matrix is row-wise
    if (num_new_nz) {
      // Adding a positive number of nonzeros
      this->index_.resize(new_num_nz);
      this->value_.resize(new_num_nz);
      // Determine the row lengths of the new columns being added
      std::vector<HighsInt> new_row_length;
      new_row_length.assign(num_row, 0);
      for (HighsInt iEl = 0; iEl < num_new_nz; iEl++)
        new_row_length[new_matrix_index[iEl]]++;
      // Now shift the indices and values to make space
      HighsInt entry_offset = num_new_nz;
      HighsInt to_original_el = this->start_[num_row];
      this->start_[num_row] = new_num_nz;
      for (HighsInt iRow = num_row - 1; iRow >= 0; iRow--) {
        entry_offset -= new_row_length[iRow];
        HighsInt from_original_el = this->start_[iRow];
        // Can now use this new_row_length to store the start for the
        // new entries
        new_row_length[iRow] = to_original_el + entry_offset;
        for (HighsInt iEl = to_original_el - 1; iEl >= from_original_el;
             iEl--) {
          this->index_[iEl + entry_offset] = this->index_[iEl];
          this->value_[iEl + entry_offset] = this->value_[iEl];
        }
        to_original_el = from_original_el;
        this->start_[iRow] = entry_offset + from_original_el;
      }
      // Now insert the indices and values for the new columns
      for (HighsInt iCol = 0; iCol < num_new_col; iCol++) {
        for (HighsInt iEl = new_matrix_start[iCol];
             iEl < new_matrix_start[iCol + 1]; iEl++) {
          HighsInt iRow = new_matrix_index[iEl];
          this->index_[new_row_length[iRow]] = num_col + iCol;
          this->value_[new_row_length[iRow]] = new_matrix_value[iEl];
          new_row_length[iRow]++;
        }
      }
    }
    // Have to increase the number of columns, even if no nonzeros are being
    // added
    this->num_col_ += num_new_col;
  }
}